

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O2

uint objgetp(mcmcxdef *mctx,objnum objn,prpnum prop,dattyp *typptr)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  byte *pbVar4;
  byte *extraout_RDX;
  int iVar6;
  uint uVar7;
  byte bVar8;
  uint16_t tmp;
  byte bVar9;
  uint uVar10;
  bool bVar11;
  ulong uVar5;
  
  bVar8 = (byte)prop;
  bVar9 = (byte)(prop >> 8);
  puVar3 = mcmlck(mctx,objn);
  uVar7 = (uint)*(ushort *)(puVar3 + 6);
  if ((puVar3[2] & 2) != 0) {
    uVar5 = (ulong)*(ushort *)(puVar3 + 8);
    pbVar4 = extraout_RDX;
    uVar2 = 0;
    uVar10 = uVar7 - 1;
    while (iVar6 = uVar10 - uVar2, (int)uVar2 <= (int)uVar10) {
      uVar1 = iVar6 / 2 + uVar2;
      uVar5 = (ulong)uVar1;
      pbVar4 = puVar3 + (long)(int)uVar1 * 4 + (ulong)*(ushort *)(puVar3 + 8);
      bVar11 = *pbVar4 < bVar8;
      if ((*pbVar4 == bVar8) && (bVar11 = pbVar4[1] < bVar9, pbVar4[1] == bVar9)) {
        uVar2 = (uint)*(ushort *)(pbVar4 + 2);
        goto LAB_0012b81b;
      }
      if (bVar11) {
        uVar2 = uVar2 + 1;
        if (2 < iVar6 + 1U) {
          uVar2 = uVar1;
        }
      }
      else {
        bVar11 = uVar1 != uVar10;
        uVar10 = uVar10 - 1;
        if (bVar11) {
          uVar10 = uVar1;
        }
      }
    }
    uVar2 = 0;
LAB_0012b81b:
    do {
      if (uVar2 == 0) goto LAB_0012b85c;
      if (((((puVar3[(ulong)uVar2 + 5] & 2) == 0) &&
           (((puVar3[(ulong)uVar2 + 5] & 4) == 0 || ((mctx->mcmcxflg & 1) != 0)))) ||
          ((int)uVar7 <= (int)uVar5)) || ((*pbVar4 != pbVar4[4] || (pbVar4[1] != pbVar4[5]))))
      goto LAB_0012b86a;
      uVar2 = (uint)*(ushort *)(pbVar4 + 6);
      pbVar4 = pbVar4 + 4;
    } while( true );
  }
  pbVar4 = puVar3 + (ulong)*(ushort *)(puVar3 + 4) * 2 + 0xe;
  uVar10 = 0;
  while (bVar11 = uVar7 != 0, uVar7 = uVar7 - 1, uVar2 = uVar10, bVar11) {
    if ((*pbVar4 == bVar8) && (pbVar4[1] == bVar9)) {
      if ((pbVar4[5] & 2) == 0) {
        if (((pbVar4[5] & 4) == 0) || ((mctx->mcmcxflg & 1) != 0)) {
          uVar2 = (int)pbVar4 - (int)puVar3;
          if (uVar2 == 0) {
            uVar2 = uVar10;
          }
          break;
        }
      }
      else {
        uVar10 = (int)pbVar4 - (int)puVar3;
      }
    }
    pbVar4 = pbVar4 + (ulong)*(ushort *)(pbVar4 + 3) + 6;
  }
LAB_0012b86a:
  if ((typptr != (dattyp *)0x0) && (uVar2 != 0)) {
    *typptr = (uint)puVar3[(ulong)uVar2 + 2];
  }
LAB_0012b87f:
  mcmunlck(mctx,objn);
  return uVar2;
LAB_0012b85c:
  uVar2 = 0;
  goto LAB_0012b87f;
}

Assistant:

uint objgetp(mcmcxdef *mctx, objnum objn, prpnum prop, dattyp *typptr)
{
    objdef *objptr;
    prpdef *p;
    int     cnt;
    uint    retval;                       /* property offset, if we find it */
    uint    ignprop; /* ignored property - use if real property isn't found */
    uchar   pbuf[2];                  /* property number in portable format */
    uchar  *indp;
    uchar  *indbase;
    int     last;
    int     first;
    int     cur;
    
    oswp2(pbuf, prop);            /* get property number in portable foramt */
    objptr = (objdef *)mcmlck(mctx, objn);      /* get a lock on the object */
    ignprop = 0;                   /* assume we won't find ignored property */
    cnt = objnprop(objptr);             /* get number of properties defined */
    retval = 0;                                          /* presume failure */
    
    if (objflg(objptr) & OBJFINDEX)
    {
        /* there's an index -> do a binary search through the index */
        indbase = (uchar *)objpfre(objptr);                   /* find index */
        first = 0;
        last = cnt - 1;
        for (;;)
        {
            if (first > last) break;           /* crossed over -> not found */
            cur = first + (last - first)/2;         /* split the difference */
            indp = indbase + cur*4;            /* get pointer to this entry */
            if (indp[0] == pbuf[0] && indp[1] == pbuf[1])
            {
                retval = osrp2(indp + 2);
                break;
            }
            else if (indp[0] < pbuf[0]
                     || (indp[0] == pbuf[0] && indp[1] < pbuf[1]))
                first = (cur == first ? first + 1 : cur);
            else
                last = (cur == last ? last - 1 : cur);
        }

        /* ignore ignored and deleted properties if possible */
        while (retval
               && ((prpflg(objptr + retval) & PRPFIGN) != 0
                   || ((prpflg(objptr + retval) & PRPFDEL) != 0
                       && (mctx->mcmcxflg & MCMCXF_NO_PRP_DEL) == 0))
               && cur < cnt && indp[0] == indp[4] && indp[1] == indp[5])
        {
            indp += 4;
            retval = osrp2(indp + 2);
        }
        if (retval && osrp2(objptr + retval) != prop)
            assert(FALSE);
    }
    else
    {
        /* there's no index -> do sequential search through properties */
        for (p = objprp(objptr) ; cnt ; p = objpnxt(p), --cnt)
        {
            /* if this is the property, and it's not being ignored, use it */
            if (*(uchar *)p == pbuf[0] && *(((uchar *)p) + 1) == pbuf[1])
            {
                if (prpflg(p) & PRPFIGN)                 /* this is ignored */
                    ignprop = objpofs(objptr, p);  /* ... make a note of it */
                else if ((prpflg(p) & PRPFDEL) != 0         /* it's deleted */
                         && (mctx->mcmcxflg & MCMCXF_NO_PRP_DEL) == 0)
                    /* simply skip it */ ;
                else
                {
                    retval = objpofs(objptr, p);         /* this is the one */
                    break;                                    /* we're done */
                }
            }
        }
    }

    if (!retval) retval = ignprop;     /* use ignored value if nothing else */
    if (retval && typptr) *typptr = prptype(objofsp(objptr, retval));
    
    mcmunlck(mctx, objn);                 /* done with object, so unlock it */
    return(retval);
}